

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O3

int __thiscall
TPZMatrix<Fad<double>_>::Subst_Diag(TPZMatrix<Fad<double>_> *this,TPZFMatrix<Fad<double>_> *B)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  int extraout_var_00;
  undefined4 extraout_var_01;
  double *pdVar4;
  double *pdVar5;
  long lVar6;
  ulong uVar7;
  double *pdVar8;
  double *pdVar9;
  long lVar10;
  Fad<double> pivot;
  Fad<double> local_b8;
  TPZMatrix<Fad<double>_> *local_98;
  TPZFMatrix<Fad<double>_> *local_90;
  long local_88;
  double local_80;
  double local_78;
  Fad<double> local_70;
  Fad<double> local_50;
  
  lVar6 = (B->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
  iVar3 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xc])();
  if (lVar6 != CONCAT44(extraout_var,iVar3)) {
    Error("TPZMatrix::Subst_Diag incompatible dimensions\n",(char *)0x0);
  }
  iVar3 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xc])(this);
  if (CONCAT44(extraout_var_00,iVar3) != 0 && -1 < extraout_var_00) {
    lVar6 = 0;
    local_98 = this;
    local_90 = B;
    do {
      (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                (&local_50,this,lVar6,lVar6);
      if (0 < (B->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol) {
        lVar10 = 0;
        local_88 = lVar6;
        do {
          (*(B->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
            [0x24])(&local_70,B,lVar6,lVar10);
          iVar2 = local_50.dx_.num_elts;
          iVar3 = local_70.dx_.num_elts;
          local_b8.val_ = local_70.val_ / local_50.val_;
          uVar1 = local_50.dx_.num_elts;
          if (local_50.dx_.num_elts < local_70.dx_.num_elts) {
            uVar1 = local_70.dx_.num_elts;
          }
          local_b8.dx_.num_elts = 0;
          local_b8.dx_.ptr_to_data = (double *)0x0;
          if (0 < (int)uVar1) {
            local_80 = local_50.val_;
            local_78 = local_70.val_;
            local_b8.dx_.num_elts = uVar1;
            local_b8.dx_.ptr_to_data = (double *)operator_new__((ulong)uVar1 * 8);
            uVar7 = 0;
            pdVar4 = local_70.dx_.ptr_to_data;
            pdVar5 = local_50.dx_.ptr_to_data;
            do {
              pdVar8 = pdVar4;
              if (iVar3 == 0) {
                pdVar8 = &local_70.defaultVal;
              }
              pdVar9 = pdVar5;
              if (iVar2 == 0) {
                pdVar9 = &local_50.defaultVal;
              }
              local_b8.dx_.ptr_to_data[uVar7] =
                   (*pdVar8 * local_80 - *pdVar9 * local_78) / (local_80 * local_80);
              uVar7 = uVar7 + 1;
              pdVar5 = pdVar5 + 1;
              pdVar4 = pdVar4 + 1;
            } while (uVar1 != uVar7);
          }
          lVar6 = local_88;
          B = local_90;
          local_b8.defaultVal = 0.0;
          (*(local_90->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable[0x23])(local_90,local_88,lVar10,&local_b8);
          Fad<double>::~Fad(&local_b8);
          Fad<double>::~Fad(&local_70);
          lVar10 = lVar10 + 1;
        } while (lVar10 < (B->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol);
      }
      Fad<double>::~Fad(&local_50);
      this = local_98;
      lVar6 = lVar6 + 1;
      iVar3 = (*(local_98->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xc])(local_98);
    } while (lVar6 < CONCAT44(extraout_var_01,iVar3));
  }
  return 1;
}

Assistant:

int TPZMatrix<TVar>::Subst_Diag( TPZFMatrix<TVar> *B ) const {
    if ( (B->Rows() != Dim())) {
        Error("TPZMatrix::Subst_Diag incompatible dimensions\n");
	}
	for ( int64_t r = 0; r < Dim(); r++ ) {
		TVar pivot = GetVal( r, r );
		for ( int64_t c = 0; c < B->Cols(); c++ ) {
			B->PutVal( r, c, B->GetVal( r, c ) / pivot );
		}
	}
	return( 1 );
}